

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toymodule.cpp
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  initializer_list<unsigned_int> __l;
  initializer_list<UinputDevice::PossibleEvent> __l_00;
  int iVar1;
  ostream *this;
  UinputDevice *this_00;
  PossibleEvent *local_140;
  vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  local_f8;
  allocator<UinputDevice::PossibleEvent> local_df;
  undefined1 local_de;
  allocator<unsigned_int> local_dd;
  uint local_dc;
  iterator local_d8;
  size_type local_d0;
  PossibleEvent *local_c8;
  PossibleEvent local_c0;
  iterator local_a0;
  pointer local_98;
  vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_> local_90;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  EVP_PKEY_CTX *pEStack_10;
  uint argc_local;
  char **argv_local;
  
  pEStack_10 = ctx;
  this = std::operator<<((ostream *)&std::cout,"Init!");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  this_00 = (UinputDevice *)operator_new(4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"/dev/uinput",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"FunKeyMonkey Toy",&local_71);
  local_de = 1;
  local_c8 = &local_c0;
  local_c0.type = 1;
  local_dc = 0x25;
  local_d8 = &local_dc;
  local_d0 = 1;
  std::allocator<unsigned_int>::allocator(&local_dd);
  __l._M_len = local_d0;
  __l._M_array = local_d8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_c0.codes,__l,&local_dd);
  local_de = 0;
  local_a0 = &local_c0;
  local_98 = (pointer)0x1;
  std::allocator<UinputDevice::PossibleEvent>::allocator(&local_df);
  __l_00._M_len = (size_type)local_98;
  __l_00._M_array = local_a0;
  std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>::vector
            (&local_90,__l_00,&local_df);
  local_f8.
  super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  ::vector(&local_f8);
  UinputDevice::UinputDevice
            (this_00,(string *)local_38,3,(string *)local_70,1,1,1,&local_90,&local_f8);
  out = this_00;
  std::
  vector<UinputDevice::AbsoluteAxisCalibrationData,_std::allocator<UinputDevice::AbsoluteAxisCalibrationData>_>
  ::~vector(&local_f8);
  std::vector<UinputDevice::PossibleEvent,_std::allocator<UinputDevice::PossibleEvent>_>::~vector
            (&local_90);
  std::allocator<UinputDevice::PossibleEvent>::~allocator(&local_df);
  local_140 = (PossibleEvent *)&local_a0;
  do {
    local_140 = local_140 + -1;
    UinputDevice::PossibleEvent::~PossibleEvent(local_140);
  } while (local_140 != &local_c0);
  std::allocator<unsigned_int>::~allocator(&local_dd);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_38);
  iVar1 = std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return iVar1;
}

Assistant:

void init(char const** argv, unsigned int argc)
{
  std::cout << "Init!" << std::endl;
  out = new UinputDevice("/dev/uinput", BUS_USB, "FunKeyMonkey Toy", 1, 1, 1, {
    { EV_KEY, { KEY_K } }
  });
}